

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O0

void serialization::
     serialize_unpack<char_const*const*&,serialization::json_oarchive,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>const&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>const&>
               (char ***arg,json_oarchive *ar,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
               *front,vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      *next)

{
  char *key_00;
  char *key;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *pvStack_28;
  serialization_trace trace;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *next_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
  *front_local;
  json_oarchive *ar_local;
  char ***arg_local;
  
  key._0_4_ = 0x15;
  pvStack_28 = next;
  serialization_trace::serialization_trace<char_const(&)[17],char_const(&)[140],int>
            ((serialization_trace *)((long)&key + 7),(char (*) [17])0x14cc54,
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_unpack.h"
             ,(int *)&key);
  key_00 = **arg;
  json_oarchive::save_key_start(ar,key_00);
  serialize_helper<serialization::json_oarchive,std::__cxx11::string,Person>(ar,front);
  json_oarchive::save_key_end(ar,key_00);
  *arg = *arg + 1;
  serialize_unpack<char_const*const*&,serialization::json_oarchive,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>const&>
            (arg,ar,pvStack_28);
  return;
}

Assistant:

inline void serialize_unpack(Argument && arg, Archive & ar, T && front, Args && ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.save_key_start(key);
    serialize_helper(ar, front);
    ar.save_key_end(key);

    serialize_unpack(++arg, ar, std::forward<Args>(next)...);
}